

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O0

permInfo * setPermInfoPtr(int var)

{
  int iVar1;
  permInfo *pi;
  int *piVar2;
  permInfo *x;
  int var_local;
  
  pi = (permInfo *)malloc(0x28);
  pi->flipCtr = 0;
  pi->varN = var;
  pi->totalFlips = (1 << ((byte)var & 0x1f)) + -1;
  pi->swapCtr = 0;
  iVar1 = factorial(var);
  pi->totalSwaps = iVar1 + -1;
  piVar2 = (int *)malloc((long)pi->totalFlips << 2);
  pi->flipArray = piVar2;
  piVar2 = (int *)malloc((long)pi->totalSwaps << 2);
  pi->swapArray = piVar2;
  fillInSwapArray(pi);
  fillInFlipArray(pi);
  return pi;
}

Assistant:

permInfo* setPermInfoPtr(int var)
{
	permInfo* x;
	x = (permInfo*) malloc(sizeof(permInfo));
	x->flipCtr=0;
	x->varN = var; 
	x->totalFlips=(1<<var)-1;
	x->swapCtr=0;
	x->totalSwaps=factorial(var)-1;
	x->flipArray = (int*) malloc(sizeof(int)*x->totalFlips);
	x->swapArray = (int*) malloc(sizeof(int)*x->totalSwaps);
	fillInSwapArray(x);
	fillInFlipArray(x);
	return x;
}